

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_Hook_amd64_gcc.cpp
# Opt level: O2

void __thiscall axl::spy::HookArena::~HookArena(HookArena *this)

{
  ExecutableBlockArena<axl::spy::Hook> *this_00;
  
  mem::ExecutableBlockArena<axl::spy::Hook>::detach
            ((ExecutableBlockArena<axl::spy::Hook> *)this->m_impl);
  this_00 = (ExecutableBlockArena<axl::spy::Hook> *)this->m_impl;
  if (this_00 != (ExecutableBlockArena<axl::spy::Hook> *)0x0) {
    mem::ExecutableBlockArena<axl::spy::Hook>::~ExecutableBlockArena(this_00);
  }
  operator_delete(this_00);
  return;
}

Assistant:

HookArena::~HookArena() {
	((mem::ExecutableBlockArena<Hook>*)m_impl)->detach(); // don't free unless explicitly requested
	delete (mem::ExecutableBlockArena<Hook>*)m_impl;
}